

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Label __thiscall
asmjit::v1_14::BaseAssembler::newNamedLabel
          (BaseAssembler *this,char *name,size_t nameSize,LabelType type,uint32_t parentId)

{
  Error EVar1;
  long in_RSI;
  char *in_RDI;
  Label LVar2;
  Error err;
  LabelEntry *le;
  uint32_t labelId;
  char *message;
  undefined4 in_stack_ffffffffffffff80;
  long local_78;
  undefined4 local_6c;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  CodeHolder *in_stack_fffffffffffffff0;
  
  local_6c = 0xffffffff;
  message = in_RDI;
  if (*(long *)(in_RSI + 0x30) != 0) {
    EVar1 = CodeHolder::newNamedLabelEntry
                      (in_stack_fffffffffffffff0,
                       (LabelEntry **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (LabelType)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                       (uint32_t)in_stack_ffffffffffffffd0);
    if (EVar1 == 0) {
      local_6c = *(undefined4 *)(local_78 + 0xc);
    }
    else {
      BaseEmitter::reportError
                ((BaseEmitter *)CONCAT44(EVar1,in_stack_ffffffffffffff80),
                 (Error)((ulong)in_RSI >> 0x20),message);
    }
  }
  in_RDI[0] = '\x05';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  *(undefined4 *)(in_RDI + 4) = local_6c;
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  LVar2.super_Operand.super_Operand_._data[0] = 0;
  LVar2.super_Operand.super_Operand_._data[1] = 0;
  LVar2.super_Operand.super_Operand_._0_8_ = message;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseAssembler::newNamedLabel(const char* name, size_t nameSize, LabelType type, uint32_t parentId) {
  uint32_t labelId = Globals::kInvalidId;
  if (ASMJIT_LIKELY(_code)) {
    LabelEntry* le;
    Error err = _code->newNamedLabelEntry(&le, name, nameSize, type, parentId);
    if (ASMJIT_UNLIKELY(err))
      reportError(err);
    else
      labelId = le->id();
  }
  return Label(labelId);
}